

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,empty_statement *param_1)

{
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const empty_statement&) {
        os_ << ';';
    }